

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O0

Name wasm::Names::getValidLocalName(Function *func,Name root)

{
  IString IVar1;
  size_t sVar2;
  string *in_R9;
  Name NVar3;
  allocator<char> local_a1;
  string local_a0 [48];
  anon_class_8_1_898bcfc2 local_70;
  function<bool_(wasm::Name)> local_68;
  Function *local_48;
  char *pcStack_40;
  Function *local_30;
  Function *func_local;
  Name root_local;
  
  pcStack_40 = root.super_IString.str._M_str;
  local_48 = root.super_IString.str._M_len;
  local_70.func = func;
  local_30 = func;
  func_local = local_48;
  root_local.super_IString.str._M_len = (size_t)pcStack_40;
  std::function<bool(wasm::Name)>::
  function<wasm::Names::getValidLocalName(wasm::Function&,wasm::Name)::_lambda(wasm::Name)_1_,void>
            ((function<bool(wasm::Name)> *)&local_68,&local_70);
  sVar2 = Function::getNumLocals(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"_",&local_a1);
  NVar3.super_IString.str._M_str = (char *)&local_68;
  NVar3.super_IString.str._M_len = (size_t)pcStack_40;
  NVar3 = getValidName((Names *)local_48,NVar3,(function<bool_(wasm::Name)> *)(sVar2 & 0xffffffff),
                       (Index)local_a0,in_R9);
  root_local.super_IString.str._M_str = NVar3.super_IString.str._M_len;
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::function<bool_(wasm::Name)>::~function(&local_68);
  IVar1.str._M_str = NVar3.super_IString.str._M_str;
  IVar1.str._M_len = (size_t)root_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

inline Name getValidLocalName(Function& func, Name root) {
  return getValidName(
    root,
    [&](Name test) { return !func.hasLocalIndex(test); },
    func.getNumLocals());
}